

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O1

void __thiscall LogWriter::~LogWriter(LogWriter *this)

{
  pointer pcVar1;
  long lVar2;
  undefined8 uVar3;
  
  this->_vptr_LogWriter = (_func_int **)&PTR__LogWriter_001b8888;
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
  }
  uVar3 = _sqrt;
  lVar2 = _VTT;
  *(long *)&this->logfile_ = _VTT;
  *(undefined8 *)(&this->logfile_ + *(long *)(lVar2 + -0x18)) = uVar3;
  std::filebuf::~filebuf((filebuf *)&this->field_0x70);
  std::ios_base::~ios_base((ios_base *)&this->field_0x160);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->cliques_)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->vertices_)._M_t);
  return;
}

Assistant:

LogWriter(std::string fn) : vertices_(), logfile_(fn, std::ofstream::out), filename_(fn), iteration_(0) {}